

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

bool __thiscall
file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::read_file(file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_contents)

{
  Decomposer local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[5]>
  local_c8;
  StringRef local_98;
  SourceLineInfo local_88;
  StringRef local_78;
  undefined1 local_68 [8];
  AssertionHandler catchAssertionHandler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_contents_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_local;
  file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)file_contents;
  local_78 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/tests.cpp",
             0x48e);
  Catch::StringRef::StringRef(&local_98,"name == \"what\"");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_68,&local_78,&local_88,local_98,Normal);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Catch::Decomposer::operator<=(&local_d1,name);
  Catch::ExprLhs<std::__cxx11::string_const&>::operator==
            (&local_c8,(ExprLhs<std::__cxx11::string_const&> *)&local_d0,(char (*) [5])"what");
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_68,&local_c8.super_ITransientExpression);
  Catch::
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[5]>
  ::~BinaryExpr(&local_c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_68);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_68);
  std::__cxx11::string::operator=((string *)catchAssertionHandler.m_resultCapture,"World");
  return true;
}

Assistant:

bool read_file(const string_type& name, string_type& file_contents) const {
        // read from file [name].mustache (fake the data for the test)
        REQUIRE(name == "what");
        file_contents = "World";
        return true;
    }